

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O3

int SubFrameParamsInit(SubFrameParams *params,int should_try,int empty_rect_allowed)

{
  int iVar1;
  uint uVar2;
  
  params->should_try_ = should_try;
  params->empty_rect_allowed_ = empty_rect_allowed;
  iVar1 = WebPPictureInitInternal(&params->sub_frame_ll_,0x20f);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = WebPPictureInitInternal(&params->sub_frame_lossy_,0x20f);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int SubFrameParamsInit(SubFrameParams* const params,
                              int should_try, int empty_rect_allowed) {
  params->should_try_ = should_try;
  params->empty_rect_allowed_ = empty_rect_allowed;
  if (!WebPPictureInit(&params->sub_frame_ll_) ||
      !WebPPictureInit(&params->sub_frame_lossy_)) {
    return 0;
  }
  return 1;
}